

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O3

void __thiscall
amrex::MFCellConsLinInterp::interp
          (MFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  int iVar1;
  int iVar2;
  pointer pBVar3;
  FArrayBox *pFVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FabArray<amrex::FArrayBox> *pFVar8;
  int koff;
  int iVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  undefined4 in_register_00000014;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  double *pdVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  bool bVar51;
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined1 auVar63 [16];
  Box result;
  MFIter mfi;
  FArrayBox tmpfab;
  ulong local_478;
  ulong local_470;
  int local_468;
  int local_464;
  ulong local_438;
  long local_428;
  double *local_3d8;
  double *local_3d0;
  long local_3c8;
  long local_3c0;
  ulong local_3b8;
  int local_374;
  int local_370;
  Box local_358;
  long local_338;
  ulong local_330;
  long local_328;
  ulong local_320;
  double *local_318;
  double *local_310;
  ulong local_308;
  long local_300;
  long local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  long local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  double *local_2c8;
  ulong local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  double *local_290;
  double *local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  double *local_260;
  long local_258;
  long local_250;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  Array4<const_double> local_218;
  long local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  long local_1c0;
  long local_1b8;
  ulong local_1b0;
  long local_1a8;
  long local_1a0;
  MFCellConsLinInterp *local_198;
  FabArray<amrex::FArrayBox> *local_190;
  FabArray<amrex::FArrayBox> *local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  pointer local_158;
  long local_150;
  long local_148;
  int *local_140;
  Box local_134;
  MFIter local_118;
  BaseFab<double> local_b8;
  Array4<double> local_70;
  
  local_2f0 = CONCAT44(in_register_00000014,ccomp);
  pBVar3 = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_244 = fcomp;
  local_198 = this;
  local_190 = &crsemf->super_FabArray<amrex::FArrayBox>;
  FArrayBox::FArrayBox((FArrayBox *)&local_b8);
  local_188 = &finemf->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_118,(FabArrayBase *)finemf,'\0');
  if (local_118.currentIndex < local_118.endIndex) {
    local_158 = pBVar3 + bcomp;
    local_240 = nc * 3;
    local_308 = (ulong)(uint)nc;
    local_1c8 = (ulong)(uint)(nc * 2);
    local_1a0 = local_1c8 * 8;
    local_1a8 = local_308 * 8;
    local_140 = pBVar3[bcomp].bc + 5;
    local_150 = (long)(int)local_2f0 << 3;
    do {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,local_188,&local_118);
      pFVar8 = local_190;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_218,local_190,&local_118);
      piVar12 = &local_118.currentIndex;
      if (local_118.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar12 = ((local_118.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_118.currentIndex;
      }
      pFVar4 = (pFVar8->m_fabs_v).
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar12];
      uVar5 = *(undefined8 *)(pFVar4->super_BaseFab<double>).domain.smallend.vect;
      uVar6 = *(undefined8 *)((long)&(pFVar4->super_BaseFab<double>).domain.smallend + 8);
      uVar7 = *(undefined8 *)((long)&(pFVar4->super_BaseFab<double>).domain.bigend + 8);
      local_358.bigend.vect[1] =
           (int)((ulong)*(undefined8 *)(pFVar4->super_BaseFab<double>).domain.bigend.vect >> 0x20);
      local_358.bigend.vect[2] = (int)uVar7;
      local_358.btype.itype = (uint)((ulong)uVar7 >> 0x20);
      local_358.smallend.vect[2] = (int)uVar6;
      local_358.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
      local_358.smallend.vect[0] = (int)uVar5;
      local_358.smallend.vect[1] = (int)((ulong)uVar5 >> 0x20);
      local_358.smallend.vect[2] = local_358.smallend.vect[2] + 1;
      local_358.bigend.vect[0] = local_358.bigend.vect[0] - 1;
      local_358.smallend.vect[1] = local_358.smallend.vect[1] + 1;
      local_358.smallend.vect[0] = local_358.smallend.vect[0] + 1;
      local_358.bigend.vect[1] = local_358.bigend.vect[1] - 1;
      local_358.bigend.vect[2] = local_358.bigend.vect[2] + -1;
      FArrayBox::resize((FArrayBox *)&local_b8,&local_358,local_240,(Arena *)0x0);
      local_260 = local_b8.dptr;
      local_250 = (long)local_b8.domain.smallend.vect[0];
      local_258 = (long)local_b8.domain.smallend.vect[1];
      local_268 = (long)local_b8.domain.smallend.vect[2];
      local_2f8 = (long)((local_b8.domain.bigend.vect[0] - local_b8.domain.smallend.vect[0]) + 1);
      local_1d8 = (long)((local_b8.domain.bigend.vect[1] - local_b8.domain.smallend.vect[1]) + 1);
      local_1b8 = local_1d8 * local_2f8;
      lVar16 = (long)((local_b8.domain.bigend.vect[2] - local_b8.domain.smallend.vect[2]) + 1);
      local_1c0 = local_1b8 * lVar16;
      BATransformer::operator()
                (&local_134,&((local_118.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_118.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_118.currentIndex] * 0x1c +
                        *(long *)&((((local_118.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar24 = local_134.smallend.vect[0] - ng->vect[0];
      uVar26 = local_134.smallend.vect[1] - ng->vect[1];
      uVar30 = local_134.smallend.vect[2] - ng->vect[2];
      uVar33 = ng->vect[0] + local_134.bigend.vect[0];
      uVar38 = ng->vect[1] + local_134.bigend.vect[1];
      uVar40 = ng->vect[2] + local_134.bigend.vect[2];
      uVar15 = (dest_domain->smallend).vect[0];
      uVar28 = (dest_domain->smallend).vect[1];
      if ((int)uVar24 <= (int)uVar15) {
        uVar24 = uVar15;
      }
      if ((int)uVar26 <= (int)uVar28) {
        uVar26 = uVar28;
      }
      uVar15 = (dest_domain->smallend).vect[2];
      if ((int)uVar30 <= (int)uVar15) {
        uVar30 = uVar15;
      }
      uVar15 = (dest_domain->bigend).vect[0];
      if ((int)uVar15 <= (int)uVar33) {
        uVar33 = uVar15;
      }
      local_1b0 = (ulong)uVar33;
      uVar15 = (dest_domain->bigend).vect[1];
      if ((int)uVar15 <= (int)uVar38) {
        uVar38 = uVar15;
      }
      uVar15 = (dest_domain->bigend).vect[2];
      if ((int)uVar15 <= (int)uVar40) {
        uVar40 = uVar15;
      }
      if (local_198->do_linear_limiting == true) {
        local_22c = local_358.bigend.vect[2];
        if (local_358.smallend.vect[2] <= local_358.bigend.vect[2]) {
          local_330 = local_358.smallend.vect._0_8_ & 0xffffffff;
          local_1d0 = (ulong)(uint)local_358.smallend.vect[1];
          local_300 = CONCAT44(local_300._4_4_,local_358.bigend.vect[0]);
          local_168 = local_258 * -8;
          local_170 = local_1a0 * lVar16 + local_268 * -8;
          local_2d0 = local_250 * -8;
          local_178 = local_1d8 * 8;
          lVar31 = local_2f8 * lVar16 * local_178;
          local_160 = lVar16 * local_1a8 + local_268 * -8;
          local_180 = -local_268;
          local_21c = local_358.smallend.vect[0] + 2;
          local_220 = local_358.smallend.vect[0] + -2;
          local_230 = local_358.smallend.vect[1] + 2;
          local_234 = local_358.smallend.vect[1] - 2;
          local_370 = local_358.smallend.vect[2] + 2;
          local_374 = local_358.smallend.vect[2] + -2;
          local_464 = local_358.smallend.vect[2] + -1;
          local_238 = local_358.smallend.vect[1] - 1;
          local_23c = local_358.smallend.vect[1] + 1;
          local_224 = local_358.smallend.vect[0] + -1;
          local_228 = local_358.smallend.vect[0] + 1;
          iVar1 = local_358.smallend.vect[2];
          local_468 = local_358.smallend.vect[2];
          do {
            local_468 = local_468 + 1;
            if (local_358.smallend.vect[1] <= local_358.bigend.vect[1]) {
              local_2d8 = (ulong)iVar1;
              local_338 = (long)local_370;
              local_148 = (long)local_374;
              local_2e0 = (local_170 + local_2d8 * 8) * local_1d8 + local_168;
              local_2e8 = (local_160 + local_2d8 * 8) * local_1d8 + local_168;
              local_310 = (double *)CONCAT44(local_310._4_4_,local_23c);
              local_318 = (double *)CONCAT44(local_318._4_4_,local_238);
              local_320 = CONCAT44(local_320._4_4_,local_234);
              local_328 = CONCAT44(local_328._4_4_,local_230);
              local_470 = local_1d0;
              do {
                if (local_358.smallend.vect[0] <= local_358.bigend.vect[0]) {
                  lVar35 = (long)(int)(uint)local_470;
                  lVar21 = (long)local_218.begin.y;
                  lVar47 = (long)local_218.begin.z;
                  lVar25 = local_218.kstride * 8;
                  lVar16 = (local_2d8 - lVar47) * lVar25;
                  lVar43 = local_218.jstride * 8;
                  lVar36 = (lVar35 - lVar21) * lVar43;
                  lVar17 = (long)local_218.begin.x;
                  local_2c0 = lVar16 + lVar36 + lVar17 * -8 + (long)local_218.p;
                  local_288 = (double *)
                              (((int)local_320 - lVar21) * lVar43 + lVar16 + lVar17 * -8 +
                              (long)local_218.p);
                  local_290 = (double *)
                              ((local_338 - lVar47) * lVar25 + lVar36 + lVar17 * -8 +
                              (long)local_218.p);
                  local_298 = (local_148 - lVar47) * lVar25 + lVar36 + lVar17 * -8 +
                              (long)local_218.p;
                  local_2a0 = (local_464 - local_218.begin.z) * lVar25 + lVar36 + lVar17 * -8 +
                              (long)local_218.p;
                  local_2a8 = (local_468 - local_218.begin.z) * lVar25 + lVar36 + lVar17 * -8 +
                              (long)local_218.p;
                  local_2b0 = ((int)local_318 - local_218.begin.y) * lVar43 + lVar16 + lVar17 * -8 +
                              (long)local_218.p;
                  local_2b8 = ((int)local_310 - local_218.begin.y) * lVar43 + lVar16 + lVar17 * -8 +
                              (long)local_218.p;
                  local_2c8 = (double *)((long)local_218.p + lVar16 + lVar36);
                  lVar36 = (local_2e0 + lVar35 * 8) * local_2f8;
                  lVar25 = (local_2e8 + lVar35 * 8) * local_2f8;
                  lVar49 = ((local_2d8 + local_180) * local_178 + local_168 + lVar35 * 8) *
                           local_2f8;
                  lVar35 = local_150 * local_218.nstride;
                  lVar47 = local_218.nstride * 8;
                  iVar45 = local_224 - local_218.begin.x;
                  iVar14 = local_228 - local_218.begin.x;
                  local_270 = CONCAT44(local_270._4_4_,(uint)local_470 + 2);
                  uVar15 = (cgeom->domain).smallend.vect[0];
                  uVar28 = (cgeom->domain).smallend.vect[1];
                  uVar20 = (cgeom->domain).bigend.vect[0];
                  uVar34 = (cgeom->domain).bigend.vect[1];
                  iVar19 = (cgeom->domain).smallend.vect[2];
                  iVar2 = (cgeom->domain).bigend.vect[2];
                  iVar27 = local_220;
                  iVar18 = local_21c;
                  local_478 = local_330;
                  do {
                    uVar41 = (uint)local_478;
                    if (0 < nc) {
                      lVar11 = (long)(int)uVar41;
                      lVar42 = local_2d0 + lVar11 * 8;
                      local_280 = CONCAT44(local_280._4_4_,iVar18);
                      local_428 = local_2c0 + (long)iVar18 * 8;
                      lVar50 = local_2c0 + lVar11 * 8;
                      local_278 = CONCAT44(local_278._4_4_,iVar27);
                      local_3c0 = local_2c0 + (long)iVar27 * 8;
                      local_3c8 = (long)local_218.p +
                                  lVar11 * 8 +
                                  ((int)local_328 - lVar21) * lVar43 + lVar16 + lVar17 * -8;
                      local_3d0 = local_288 + lVar11;
                      local_3d8 = local_290 + lVar11;
                      lVar23 = local_298 + lVar11 * 8;
                      lVar39 = local_2a0 + lVar11 * 8;
                      lVar29 = local_2a8 + lVar11 * 8;
                      lVar37 = local_2b0 + lVar11 * 8;
                      lVar11 = local_2b8 + lVar11 * 8;
                      pdVar44 = local_2c8 + iVar45;
                      pdVar32 = local_2c8 + iVar14;
                      dVar59 = 1.0;
                      dVar54 = 1.0;
                      piVar12 = local_140;
                      uVar22 = local_308;
                      lVar48 = lVar42;
                      dVar57 = 1.0;
                      do {
                        dVar58 = *(double *)((long)pdVar32 + lVar35);
                        dVar55 = *(double *)((long)pdVar44 + lVar35);
                        dVar52 = (dVar58 - dVar55) * 0.5;
                        if ((uVar15 == uVar41) && (((BCRec *)(piVar12 + -5))->bc[0] - 3U < 2)) {
                          if ((int)(uVar41 + 2) < local_218.end.x) {
                            dVar52 = *(double *)(local_428 + lVar35) * -0.1 +
                                     dVar58 * 0.6666666666666666 +
                                     dVar55 * -1.0666666666666667 +
                                     *(double *)(lVar50 + lVar35) * 0.5;
                          }
                          else {
                            dVar52 = (dVar55 * -6.0 + *(double *)(lVar50 + lVar35) * 5.0 + dVar58) *
                                     0.25;
                          }
                        }
                        if ((uVar20 == uVar41) && (piVar12[-2] - 3U < 2)) {
                          if ((int)(uVar41 - 2) < local_218.begin.x) {
                            dVar52 = (dVar58 * -6.0 + *(double *)(lVar50 + lVar35) * 5.0 + dVar55) *
                                     -0.25;
                          }
                          else {
                            dVar52 = *(double *)(local_3c0 + lVar35) * 0.1 +
                                     dVar55 * -0.6666666666666666 +
                                     dVar58 * 1.0666666666666667 +
                                     *(double *)(lVar50 + lVar35) * -0.5;
                          }
                        }
                        dVar55 = *(double *)(lVar50 + lVar35) - dVar55;
                        dVar58 = dVar58 - *(double *)(lVar50 + lVar35);
                        dVar55 = dVar55 + dVar55;
                        dVar58 = dVar58 + dVar58;
                        dVar56 = 0.0;
                        if (0.0 <= dVar58 * dVar55) {
                          dVar56 = ABS(dVar55);
                          dVar58 = ABS(dVar58);
                          if (dVar58 <= dVar56) {
                            dVar56 = dVar58;
                          }
                        }
                        if ((dVar52 != 0.0) || (dVar58 = dVar59, NAN(dVar52))) {
                          dVar58 = ABS(dVar52);
                          if (dVar56 <= ABS(dVar52)) {
                            dVar58 = dVar56;
                          }
                          dVar58 = (dVar58 * (double)((ulong)dVar52 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar52;
                          if (dVar59 <= dVar58) {
                            dVar58 = dVar59;
                          }
                        }
                        dVar59 = dVar58;
                        *(double *)((long)local_260 + lVar48 + lVar49) = dVar52;
                        dVar58 = *(double *)(lVar11 + lVar35);
                        dVar55 = *(double *)(lVar37 + lVar35);
                        dVar52 = (dVar58 - dVar55) * 0.5;
                        if ((uVar28 == (uint)local_470) && (piVar12[-4] - 3U < 2)) {
                          if ((int)((uint)local_470 + 2) < local_218.end.y) {
                            dVar52 = *(double *)(local_3c8 + lVar35) * -0.1 +
                                     dVar58 * 0.6666666666666666 +
                                     dVar55 * -1.0666666666666667 +
                                     *(double *)(lVar50 + lVar35) * 0.5;
                          }
                          else {
                            dVar52 = (dVar55 * -6.0 + *(double *)(lVar50 + lVar35) * 5.0 + dVar58) *
                                     0.25;
                          }
                        }
                        if (uVar34 == (uint)local_470) {
                          dVar56 = *(double *)(lVar50 + lVar35);
                          if (piVar12[-1] - 3U < 2) {
                            if ((int)((uint)local_470 - 2) < local_218.begin.y) {
                              dVar52 = (dVar58 * -6.0 + dVar56 * 5.0 + dVar55) * -0.25;
                            }
                            else {
                              dVar52 = *(double *)((long)local_3d0 + lVar35) * 0.1 +
                                       dVar55 * -0.6666666666666666 +
                                       dVar58 * 1.0666666666666667 + dVar56 * -0.5;
                            }
                          }
                        }
                        else {
                          dVar56 = *(double *)(lVar50 + lVar35);
                        }
                        dVar55 = (dVar56 - dVar55) + (dVar56 - dVar55);
                        dVar56 = (dVar58 - dVar56) + (dVar58 - dVar56);
                        dVar58 = 0.0;
                        if (0.0 <= dVar56 * dVar55) {
                          dVar58 = ABS(dVar55);
                          dVar56 = ABS(dVar56);
                          if (dVar56 <= dVar58) {
                            dVar58 = dVar56;
                          }
                        }
                        if ((dVar52 != 0.0) || (dVar55 = dVar57, NAN(dVar52))) {
                          dVar55 = ABS(dVar52);
                          if (dVar58 <= ABS(dVar52)) {
                            dVar55 = dVar58;
                          }
                          dVar55 = (dVar55 * (double)((ulong)dVar52 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar52;
                          if (dVar57 <= dVar55) {
                            dVar55 = dVar57;
                          }
                        }
                        *(double *)((long)local_260 + lVar48 + lVar25) = dVar52;
                        dVar57 = *(double *)(lVar29 + lVar35);
                        dVar58 = *(double *)(lVar39 + lVar35);
                        dVar52 = (dVar57 - dVar58) * 0.5;
                        if ((iVar19 == iVar1) && (piVar12[-3] - 3U < 2)) {
                          if (iVar1 + 2 < local_218.end.z) {
                            dVar52 = *(double *)((long)local_3d8 + lVar35) * -0.1 +
                                     dVar57 * 0.6666666666666666 +
                                     dVar58 * -1.0666666666666667 +
                                     *(double *)(lVar50 + lVar35) * 0.5;
                          }
                          else {
                            dVar52 = (dVar58 * -6.0 + *(double *)(lVar50 + lVar35) * 5.0 + dVar57) *
                                     0.25;
                          }
                        }
                        if (iVar2 == iVar1) {
                          dVar56 = *(double *)(lVar50 + lVar35);
                          if (*piVar12 - 3U < 2) {
                            if (iVar1 + -2 < local_218.begin.z) {
                              dVar52 = (dVar57 * -6.0 + dVar56 * 5.0 + dVar58) * -0.25;
                            }
                            else {
                              dVar52 = *(double *)(lVar23 + lVar35) * 0.1 +
                                       dVar58 * -0.6666666666666666 +
                                       dVar57 * 1.0666666666666667 + dVar56 * -0.5;
                            }
                          }
                        }
                        else {
                          dVar56 = *(double *)(lVar50 + lVar35);
                        }
                        dVar58 = (dVar56 - dVar58) + (dVar56 - dVar58);
                        dVar56 = (dVar57 - dVar56) + (dVar57 - dVar56);
                        dVar57 = 0.0;
                        if (0.0 <= dVar56 * dVar58) {
                          dVar57 = ABS(dVar58);
                          dVar56 = ABS(dVar56);
                          if (dVar56 <= dVar57) {
                            dVar57 = dVar56;
                          }
                        }
                        if ((dVar52 != 0.0) || (dVar58 = dVar54, NAN(dVar52))) {
                          dVar58 = ABS(dVar52);
                          if (dVar57 <= ABS(dVar52)) {
                            dVar58 = dVar57;
                          }
                          dVar58 = (dVar58 * (double)((ulong)dVar52 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar52;
                          if (dVar54 <= dVar58) {
                            dVar58 = dVar54;
                          }
                        }
                        dVar54 = dVar58;
                        *(double *)((long)local_260 + lVar48 + lVar36) = dVar52;
                        lVar48 = lVar48 + lVar31;
                        piVar12 = piVar12 + 6;
                        local_428 = local_428 + lVar47;
                        lVar50 = lVar50 + lVar47;
                        local_3c0 = local_3c0 + lVar47;
                        local_3c8 = local_3c8 + lVar47;
                        local_3d0 = local_3d0 + local_218.nstride;
                        local_3d8 = local_3d8 + local_218.nstride;
                        lVar23 = lVar23 + lVar47;
                        lVar39 = lVar39 + lVar47;
                        lVar29 = lVar29 + lVar47;
                        lVar37 = lVar37 + lVar47;
                        lVar11 = lVar11 + lVar47;
                        pdVar44 = pdVar44 + local_218.nstride;
                        pdVar32 = pdVar32 + local_218.nstride;
                        uVar22 = uVar22 - 1;
                        uVar13 = local_308;
                        dVar57 = dVar55;
                      } while (uVar22 != 0);
                      do {
                        *(double *)((long)local_260 + lVar42 + lVar49) =
                             *(double *)((long)local_260 + lVar42 + lVar49) * dVar59;
                        *(double *)((long)local_260 + lVar42 + lVar25) =
                             *(double *)((long)local_260 + lVar42 + lVar25) * dVar55;
                        *(double *)((long)local_260 + lVar42 + lVar36) =
                             *(double *)((long)local_260 + lVar42 + lVar36) * dVar54;
                        lVar42 = lVar42 + lVar31;
                        uVar13 = uVar13 - 1;
                      } while (uVar13 != 0);
                    }
                    local_478 = (ulong)(uVar41 + 1);
                    iVar18 = iVar18 + 1;
                    iVar27 = iVar27 + 1;
                    iVar45 = iVar45 + 1;
                    iVar14 = iVar14 + 1;
                  } while (uVar41 != local_358.bigend.vect[0]);
                }
                local_328 = CONCAT44(local_328._4_4_,(int)local_328 + 1);
                local_320 = CONCAT44(local_320._4_4_,(int)local_320 + 1);
                local_318 = (double *)CONCAT44(local_318._4_4_,(int)local_318 + 1);
                local_310 = (double *)CONCAT44(local_310._4_4_,(int)local_310 + 1);
                bVar51 = (uint)local_470 != local_358.bigend.vect[1];
                local_470 = (ulong)((uint)local_470 + 1);
              } while (bVar51);
            }
            local_370 = local_370 + 1;
            local_374 = local_374 + 1;
            local_464 = local_464 + 1;
            bVar51 = iVar1 != local_358.bigend.vect[2];
            iVar1 = iVar1 + 1;
          } while (bVar51);
        }
LAB_0058ced6:
        if (0 < nc) {
          local_438 = 0;
          iVar1 = local_244;
          do {
            if ((int)uVar30 <= (int)uVar40) {
              iVar19 = (int)local_438;
              uVar15 = uVar30;
              do {
                if ((int)uVar26 <= (int)uVar38) {
                  iVar2 = ratio->vect[0];
                  iVar27 = ratio->vect[1];
                  iVar18 = ratio->vect[2];
                  uVar28 = uVar26;
                  do {
                    if ((int)uVar24 <= (int)uVar33) {
                      pdVar44 = (double *)
                                ((long)local_70.p +
                                ((long)(int)uVar28 - (long)local_70.begin.y) * local_70.jstride * 8
                                + local_70.nstride * (long)iVar1 * 8 +
                                  ((long)(int)uVar15 - (long)local_70.begin.z) * local_70.kstride *
                                  8 + (long)local_70.begin.x * -8 + (long)(int)uVar24 * 8);
                      uVar22 = (long)(int)uVar24;
                      uVar20 = ~uVar24;
                      do {
                        uVar34 = (uint)uVar22;
                        if (iVar2 == 4) {
                          if ((long)uVar22 < 0) {
                            uVar41 = (int)uVar34 >> 2;
                          }
                          else {
                            uVar41 = uVar34 >> 2;
                          }
                        }
                        else if (iVar2 == 2) {
                          if ((long)uVar22 < 0) {
                            uVar41 = (int)uVar34 >> 1;
                          }
                          else {
                            uVar41 = uVar34 >> 1;
                          }
                        }
                        else {
                          uVar41 = uVar34;
                          if (iVar2 != 1) {
                            if ((long)uVar22 < 0) {
                              uVar41 = ~((int)uVar20 / iVar2);
                            }
                            else {
                              uVar41 = (uint)((long)((ulong)(uint)((int)uVar34 >> 0x1f) << 0x20 |
                                                    uVar22 & 0xffffffff) / (long)iVar2);
                            }
                          }
                        }
                        uVar46 = uVar28;
                        if (((iVar27 != 1) && (uVar46 = (int)uVar28 >> 2, iVar27 != 4)) &&
                           (uVar46 = (int)uVar28 >> 1, iVar27 != 2)) {
                          if ((int)uVar28 < 0) {
                            uVar46 = ~((int)~uVar28 / iVar27);
                          }
                          else {
                            uVar46 = (int)uVar28 / iVar27;
                          }
                        }
                        uVar10 = uVar15;
                        if (((iVar18 != 1) && (uVar10 = (int)uVar15 >> 2, iVar18 != 4)) &&
                           (uVar10 = (int)uVar15 >> 1, iVar18 != 2)) {
                          if ((int)uVar15 < 0) {
                            uVar10 = ~((int)~uVar15 / iVar18);
                          }
                          else {
                            uVar10 = (int)uVar15 / iVar18;
                          }
                        }
                        lVar16 = (long)(int)(uVar41 - (int)local_250);
                        lVar17 = (int)(uVar46 - (int)local_258) * local_2f8;
                        lVar31 = (int)(uVar10 - (int)local_268) * local_1b8;
                        *pdVar44 = (((double)(int)(uVar15 - uVar10 * iVar18) + 0.5) / (double)iVar18
                                   + -0.5) * local_260[lVar17 + lVar16 + lVar31 + ((int)local_1c8 +
                                                                                  iVar19) * 
                                                  local_1c0] +
                                   (((double)(int)(uVar28 - uVar46 * iVar27) + 0.5) / (double)iVar27
                                   + -0.5) * local_260[lVar17 + lVar16 + lVar31 + (nc + iVar19) *
                                                                                  local_1c0] +
                                   (((double)(int)(-iVar2 * uVar41 + uVar34) + 0.5) / (double)iVar2
                                   + -0.5) * local_260[lVar17 + lVar16 + lVar31 + local_438 *
                                                                                  local_1c0] +
                                   local_218.p
                                   [((long)(int)uVar46 - (long)local_218.begin.y) *
                                    local_218.jstride +
                                    ((long)(int)uVar41 - (long)local_218.begin.x) +
                                    ((long)(int)uVar10 - (long)local_218.begin.z) *
                                    local_218.kstride +
                                    local_218.nstride * ((int)local_2f0 + iVar19)];
                        uVar22 = uVar22 + 1;
                        iVar14 = uVar33 + uVar20;
                        uVar20 = uVar20 - 1;
                        pdVar44 = pdVar44 + 1;
                      } while (iVar14 != -1);
                    }
                    bVar51 = uVar28 != uVar38;
                    uVar28 = uVar28 + 1;
                  } while (bVar51);
                }
                bVar51 = uVar15 != uVar40;
                uVar15 = uVar15 + 1;
              } while (bVar51);
            }
            local_438 = local_438 + 1;
            iVar1 = iVar1 + 1;
          } while (local_438 != local_308);
        }
      }
      else if (0 < nc) {
        local_338 = CONCAT44(local_338._4_4_,local_358.smallend.vect[2]);
        local_320 = (ulong)(uint)local_358.bigend.vect[0];
        local_2d8 = (ulong)(uint)local_358.bigend.vect[1];
        local_328 = (long)local_358.smallend.vect[0];
        local_2e8 = CONCAT44(local_2e8._4_4_,local_358.smallend.vect[0] + -1);
        local_3b8 = 0;
        local_330 = CONCAT44(local_330._4_4_,local_358.bigend.vect[1] + 1U);
        do {
          if (local_358.smallend.vect[2] <= local_358.bigend.vect[2]) {
            iVar19 = (int)local_3b8;
            pBVar3 = local_158 + local_3b8;
            local_2e0 = (long)((int)local_2f0 + iVar19);
            iVar1 = local_358.smallend.vect[2];
            do {
              if (local_358.smallend.vect[1] <= local_358.bigend.vect[1]) {
                lVar25 = (long)local_218.begin.x;
                lVar21 = (iVar1 - local_218.begin.z) * local_218.kstride;
                lVar17 = local_218.nstride * local_2e0;
                local_2c0 = (ulong)(uint)~local_218.begin.y;
                local_298 = ((iVar1 + 2) - local_218.begin.z) * local_218.kstride;
                local_2a0 = ((iVar1 + -2) - local_218.begin.z) * local_218.kstride;
                local_2c8 = local_260 + (iVar1 - (int)local_268) * local_1b8;
                lVar16 = (long)(cgeom->domain).smallend.vect[0];
                local_278 = lVar16 - lVar25;
                local_280 = lVar16 + 2;
                local_2a8 = local_280 - lVar25;
                lVar31 = (long)(cgeom->domain).bigend.vect[0];
                local_300 = lVar31 - lVar25;
                local_2b0 = (lVar31 + -2) - lVar25;
                local_2d0 = (ulong)(uint)((local_358.smallend.vect[0] + -1) - local_218.begin.x);
                local_310 = local_218.p;
                local_318 = local_218.p + lVar17 + lVar21;
                uVar15 = (cgeom->domain).smallend.vect[1];
                iVar2 = (cgeom->domain).smallend.vect[2];
                uVar28 = (cgeom->domain).bigend.vect[1];
                iVar27 = (cgeom->domain).bigend.vect[2];
                uVar20 = local_358.smallend.vect[1];
                do {
                  if (local_358.smallend.vect[0] <= local_358.bigend.vect[0]) {
                    lVar36 = (int)(uVar20 - local_218.begin.y) * local_218.jstride;
                    local_2b8 = CONCAT44(local_2b8._4_4_,uVar20 + 1);
                    local_288 = local_318 +
                                (int)((uVar20 + 2) - local_218.begin.y) * local_218.jstride;
                    local_290 = local_318 +
                                (int)((uVar20 - 2) - local_218.begin.y) * local_218.jstride;
                    lVar43 = (int)(uVar20 - (int)local_258) * local_2f8;
                    local_270 = (long)local_218.end.x;
                    iVar18 = ratio->vect[1];
                    iVar14 = ratio->vect[2];
                    iVar45 = ratio->vect[0];
                    auVar53._0_8_ = (double)(iVar45 * 2);
                    auVar53._8_8_ = (double)(iVar14 * 2);
                    uVar22 = local_2d0;
                    lVar35 = local_328;
                    do {
                      iVar9 = (int)(lVar35 + 1);
                      dVar57 = local_218.p[lVar36 + lVar21 + lVar17 + (iVar9 - local_218.begin.x)];
                      dVar59 = local_218.p
                               [lVar36 + lVar21 + lVar17 + (~local_218.begin.x + (int)lVar35)];
                      dVar54 = (dVar57 - dVar59) * 0.5;
                      if ((lVar35 == lVar16) && (pBVar3->bc[0] - 3U < 2)) {
                        if (local_280 < local_270) {
                          dVar54 = local_218.p[lVar36 + lVar21 + lVar17 + local_2a8] * -0.1 +
                                   dVar57 * 0.6666666666666666 +
                                   dVar59 * -1.0666666666666667 +
                                   local_218.p[lVar36 + lVar21 + lVar17 + local_278] * 0.5;
                        }
                        else {
                          dVar54 = (dVar59 * -6.0 +
                                   local_218.p[lVar36 + lVar21 + lVar17 + local_278] * 5.0 + dVar57)
                                   * 0.25;
                        }
                      }
                      if ((lVar35 == lVar31) && (pBVar3->bc[3] - 3U < 2)) {
                        if (lVar31 + -2 < lVar25) {
                          dVar54 = (dVar57 * -6.0 +
                                   local_218.p[lVar36 + lVar21 + lVar17 + local_300] * 5.0 + dVar59)
                                   * -0.25;
                        }
                        else {
                          dVar54 = local_218.p[lVar36 + lVar21 + lVar17 + local_2b0] * 0.1 +
                                   dVar59 * -0.6666666666666666 +
                                   dVar57 * 1.0666666666666667 +
                                   local_218.p[lVar36 + lVar21 + lVar17 + local_300] * -0.5;
                        }
                      }
                      lVar47 = (long)((int)lVar35 - local_218.begin.x);
                      dVar58 = local_218.p[lVar36 + lVar47 + lVar21 + lVar17];
                      dVar59 = (dVar58 - dVar59) + (dVar58 - dVar59);
                      dVar55 = (dVar57 - dVar58) + (dVar57 - dVar58);
                      dVar57 = 0.0;
                      if (0.0 <= dVar55 * dVar59) {
                        dVar57 = ABS(dVar59);
                        dVar55 = ABS(dVar55);
                        if (dVar55 <= dVar57) {
                          dVar57 = dVar55;
                        }
                      }
                      dVar59 = local_318[(int)((uVar20 + 1) - local_218.begin.y) * local_218.jstride
                                         + lVar47];
                      dVar55 = local_318[(int)(~local_218.begin.y + uVar20) * local_218.jstride +
                                         lVar47];
                      dVar52 = (dVar59 - dVar55) * 0.5;
                      if ((uVar15 == uVar20) && (pBVar3->bc[1] - 3U < 2)) {
                        if ((int)(uVar20 + 2) < local_218.end.y) {
                          dVar52 = local_288[lVar47] * -0.1 +
                                   dVar59 * 0.6666666666666666 +
                                   dVar55 * -1.0666666666666667 + dVar58 * 0.5;
                        }
                        else {
                          dVar52 = (dVar55 * -6.0 + dVar58 * 5.0 + dVar59) * 0.25;
                        }
                      }
                      if ((uVar28 == uVar20) && (pBVar3->bc[4] - 3U < 2)) {
                        if ((int)(uVar20 - 2) < local_218.begin.y) {
                          dVar52 = (dVar59 * -6.0 + dVar58 * 5.0 + dVar55) * -0.25;
                        }
                        else {
                          dVar52 = local_290[lVar47] * 0.1 +
                                   dVar55 * -0.6666666666666666 +
                                   dVar59 * 1.0666666666666667 + dVar58 * -0.5;
                        }
                      }
                      dVar55 = (dVar58 - dVar55) + (dVar58 - dVar55);
                      dVar56 = (dVar59 - dVar58) + (dVar59 - dVar58);
                      dVar59 = 0.0;
                      if (0.0 <= dVar56 * dVar55) {
                        dVar59 = ABS(dVar55);
                        dVar56 = ABS(dVar56);
                        if (dVar56 <= dVar59) {
                          dVar59 = dVar56;
                        }
                      }
                      dVar55 = local_218.p
                               [lVar36 + lVar47 + ((iVar1 + 1) - local_218.begin.z) *
                                                  local_218.kstride + lVar17];
                      dVar56 = local_218.p
                               [lVar36 + lVar47 + (~local_218.begin.z + iVar1) * local_218.kstride +
                                                  lVar17];
                      dVar60 = (dVar55 - dVar56) * 0.5;
                      if ((iVar2 == iVar1) && (pBVar3->bc[2] - 3U < 2)) {
                        if (iVar1 + 2 < local_218.end.z) {
                          dVar60 = local_218.p[lVar36 + lVar47 + local_298 + lVar17] * -0.1 +
                                   dVar55 * 0.6666666666666666 +
                                   dVar56 * -1.0666666666666667 + dVar58 * 0.5;
                        }
                        else {
                          dVar60 = (dVar56 * -6.0 + dVar58 * 5.0 + dVar55) * 0.25;
                        }
                      }
                      if ((iVar27 == iVar1) && (pBVar3->bc[5] - 3U < 2)) {
                        if (iVar1 + -2 < local_218.begin.z) {
                          dVar60 = (dVar55 * -6.0 + dVar58 * 5.0 + dVar56) * -0.25;
                        }
                        else {
                          dVar60 = local_218.p[lVar36 + lVar47 + local_2a0 + lVar17] * 0.1 +
                                   dVar56 * -0.6666666666666666 +
                                   dVar55 * 1.0666666666666667 + dVar58 * -0.5;
                        }
                      }
                      dVar56 = (dVar58 - dVar56) + (dVar58 - dVar56);
                      dVar55 = (dVar55 - dVar58) + (dVar55 - dVar58);
                      uVar61 = 0;
                      uVar62 = 0;
                      if (0.0 <= dVar55 * dVar56) {
                        dVar56 = ABS(dVar56);
                        dVar55 = ABS(dVar55);
                        if (dVar55 <= dVar56) {
                          dVar56 = dVar55;
                        }
                        uVar61 = SUB84(dVar56,0);
                        uVar62 = (undefined4)((ulong)dVar56 >> 0x20);
                      }
                      dVar55 = ABS(dVar54);
                      if (dVar57 <= ABS(dVar54)) {
                        dVar55 = dVar57;
                      }
                      dVar55 = dVar55 * (double)((ulong)dVar54 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      dVar57 = ABS(dVar52);
                      if (dVar59 <= ABS(dVar52)) {
                        dVar57 = dVar59;
                      }
                      dVar57 = dVar57 * (double)((ulong)dVar52 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      dVar59 = ABS(dVar60);
                      if ((double)CONCAT44(uVar62,uVar61) <= dVar59) {
                        dVar59 = (double)CONCAT44(uVar62,uVar61);
                      }
                      dVar59 = dVar59 * (double)((ulong)dVar60 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      if ((((dVar55 != 0.0) || (NAN(dVar55))) || (dVar57 != 0.0)) || (NAN(dVar57)))
                      {
LAB_0058ccfe:
                        lVar47 = -1;
                        dVar52 = dVar58;
                        dVar54 = dVar58;
                        do {
                          lVar49 = -1;
                          do {
                            lVar42 = 0;
                            dVar56 = dVar52;
                            dVar60 = dVar54;
                            do {
                              dVar54 = local_218.p
                                       [lVar17 + ((iVar1 - local_218.begin.z) + (int)lVar47) *
                                                 local_218.kstride +
                                                 (int)((uVar20 - local_218.begin.y) + (int)lVar49) *
                                                 local_218.jstride +
                                                 (long)((int)uVar22 + (int)lVar42)];
                              dVar52 = dVar54;
                              if (dVar56 <= dVar54) {
                                dVar52 = dVar56;
                              }
                              if (dVar54 <= dVar60) {
                                dVar54 = dVar60;
                              }
                              lVar42 = lVar42 + 1;
                              dVar56 = dVar52;
                              dVar60 = dVar54;
                            } while (lVar42 != 3);
                            lVar49 = lVar49 + 1;
                          } while (lVar49 != 2);
                          lVar47 = lVar47 + 1;
                        } while (lVar47 != 2);
                        auVar63._0_8_ = ABS(dVar55) * (double)(iVar45 + -1);
                        auVar63._8_8_ = ABS(dVar59) * (double)(iVar14 + -1);
                        auVar63 = divpd(auVar63,auVar53);
                        dVar56 = auVar63._8_8_ +
                                 (ABS(dVar57) * (double)(iVar18 + -1)) / (double)(iVar18 * 2) +
                                 auVar63._0_8_;
                        uVar13 = -(ulong)(dVar54 - dVar58 < dVar56);
                        dVar54 = (double)(~uVar13 & 0x3ff0000000000000 |
                                         (ulong)((dVar54 - dVar58) / dVar56) & uVar13);
                        if (dVar58 - dVar52 < dVar56 * dVar54) {
                          dVar54 = (dVar58 - dVar52) / dVar56;
                        }
                      }
                      else {
                        dVar54 = 1.0;
                        if ((dVar59 != 0.0) || (NAN(dVar59))) goto LAB_0058ccfe;
                      }
                      lVar47 = lVar35 - local_250;
                      local_2c8[lVar43 + lVar47 + local_3b8 * local_1c0] = dVar55 * dVar54;
                      local_2c8[lVar43 + lVar47 + (nc + iVar19) * local_1c0] = dVar57 * dVar54;
                      local_2c8[lVar43 + lVar47 + ((int)local_1c8 + iVar19) * local_1c0] =
                           dVar59 * dVar54;
                      uVar22 = uVar22 + 1;
                      lVar35 = lVar35 + 1;
                    } while (local_358.bigend.vect[0] + 1U != iVar9);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != local_358.bigend.vect[1] + 1U);
              }
              bVar51 = iVar1 != local_358.bigend.vect[2];
              iVar1 = iVar1 + 1;
            } while (bVar51);
          }
          local_3b8 = local_3b8 + 1;
        } while (local_3b8 != local_308);
        goto LAB_0058ced6;
      }
      MFIter::operator++(&local_118);
    } while (local_118.currentIndex < local_118.endIndex);
  }
  MFIter::~MFIter(&local_118);
  local_b8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_b8);
  return;
}

Assistant:

void
MFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                             IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                             Box const& dest_domain, IntVect const& ratio,
                             Vector<BCRec> const& bcs, int bcomp)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);
    amrex::ignore_unused(fgeom);

    Box const& cdomain = cgeom.Domain();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        MultiFab crse_tmp(crsemf.boxArray(), crsemf.DistributionMap(), AMREX_SPACEDIM*nc, 0);
        auto const& crse = crsemf.const_arrays();
        auto const& tmp = crse_tmp.arrays();
        auto const& ctmp = crse_tmp.const_arrays();
        auto const& fine = finemf.arrays();

        Gpu::DeviceVector<BCRec> d_bc(nc);
        BCRec const* pbc = d_bc.data();
        Gpu::copyAsync(Gpu::hostToDevice, bcs.begin()+bcomp, bcs.begin()+bcomp+nc, d_bc.begin());

#if (AMREX_SPACEDIM == 1)
        if (cgeom.IsSPHERICAL()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,0,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp[box_no], crse[box_no], ccomp, nc,
                                                        cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
            {
                if (dest_domain.contains(i,0,0)) {
                    mf_cell_cons_lin_interp_sph(i, n, fine[box_no], fcomp, ctmp[box_no],
                                                crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#elif (AMREX_SPACEDIM == 2)
        if (cgeom.IsRZ()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_rz(i,j,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                       cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
            {
                if (dest_domain.contains(i,j,0)) {
                    mf_cell_cons_lin_interp_rz(i, j, n, fine[box_no], fcomp, ctmp[box_no],
                                               crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#endif
        {
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,k, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, ratio, pbc);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                if (dest_domain.contains(i,j,k)) {
                    mf_cell_cons_lin_interp(i,j,k,n, fine[box_no], fcomp, ctmp[box_no],
                                            crse[box_no], ccomp, nc, ratio);
                }
            });
        }

        Gpu::streamSynchronize();
    } else
#endif
    {
        BCRec const* pbc = bcs.data() + bcomp;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            FArrayBox tmpfab;
            for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
                auto const& fine = finemf.array(mfi);
                auto const& crse = crsemf.const_array(mfi);

                Box const& cbox = amrex::grow(crsemf[mfi].box(), -1);
                tmpfab.resize(cbox, AMREX_SPACEDIM*nc);
                auto const& tmp = tmpfab.array();
                auto const& ctmp = tmpfab.const_array();

                Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;

#if (AMREX_SPACEDIM == 1)
                if (cgeom.IsSPHERICAL()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,0,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crse, ccomp, nc,
                                                                cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_sph(i, n, fine, fcomp, ctmp,
                                                    crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#elif (AMREX_SPACEDIM == 2)
                if (cgeom.IsRZ()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crse, ccomp, nc,
                                                               cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_rz(i, j, n, fine, fcomp, ctmp,
                                                   crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#endif
                {
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int k) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int k, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crse, ccomp, nc,
                                                            cdomain, ratio, pbc);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        mf_cell_cons_lin_interp(i,j,k,n, fine, fcomp, ctmp,
                                                crse, ccomp, nc, ratio);
                    });
                }
            }
        }
    }
}